

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProgressBar.cpp
# Opt level: O1

void __thiscall OpenMD::ProgressBar::update(ProgressBar *this)

{
  int iVar1;
  long lVar2;
  code cVar3;
  ushort uVar4;
  int iVar5;
  char *pcVar6;
  time_t tVar7;
  tm *__tp;
  size_t sVar8;
  uint uVar9;
  double dVar10;
  double dVar11;
  time_t end_;
  winsize w;
  char buffer [22];
  char local_61;
  double local_60;
  long local_58;
  undefined1 local_50 [2];
  ushort local_4e;
  char local_48 [32];
  
  iVar5 = fileno(_stdout);
  iVar5 = isatty(iVar5);
  if (iVar5 != 0) {
    pcVar6 = getenv("SGE_TASK_ID");
    if (pcVar6 == (char *)0x0) {
      iVar5 = fileno(_stdout);
      ioctl(iVar5,0x5413,local_50);
      uVar4 = 0x50;
      if (local_4e != 0) {
        uVar4 = local_4e;
      }
      this->iteration_ = this->iteration_ + 1;
      if (0.0 < this->maximum_) {
        iVar5 = uVar4 - 0x27;
        dVar11 = (this->value_ * 100.0) / this->maximum_;
        dVar10 = 1e-06;
        if (1e-06 <= dVar11) {
          dVar10 = dVar11;
        }
        local_60 = 100.0;
        if (dVar10 <= 100.0) {
          local_60 = dVar10;
        }
        uVar9 = (uint)(((double)iVar5 * local_60) / 100.0);
        tVar7 = time((time_t *)0x0);
        local_58 = (long)((100.0 / local_60) * (double)(tVar7 - this->start_) + (double)this->start_
                         );
        __tp = localtime(&local_58);
        strftime(local_48,0x16,"%a %b %d @ %I:%M %p",__tp);
        local_61 = '\r';
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
        lVar2 = std::cout;
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             3;
        *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(lVar2 + -0x18)) & 0xffffff4f | 0x80;
        std::ostream::operator<<(&std::cout,(int)local_60);
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             3;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"% [",3);
        lVar2 = *(long *)(std::cout + -0x18);
        if ((&DAT_0030e521)[lVar2] == '\0') {
          cVar3 = (code)std::ios::widen((char)lVar2 + '@');
          std::__throw_out_of_range_fmt[lVar2] = cVar3;
          (&DAT_0030e521)[lVar2] = 1;
        }
        std::__throw_out_of_range_fmt[lVar2] = (code)0x23;
        iVar1 = uVar9 + 1;
        if (iVar1 < iVar5) {
          *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
               (long)iVar1;
          local_61 = progressSpinner_[this->iteration_ & 3];
        }
        else {
          *(long *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
               (long)iVar5;
          local_61 = '#';
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
        lVar2 = *(long *)(std::cout + -0x18);
        if ((&DAT_0030e521)[lVar2] == '\0') {
          cVar3 = (code)std::ios::widen((char)lVar2 + '@');
          std::__throw_out_of_range_fmt[lVar2] = cVar3;
          (&DAT_0030e521)[lVar2] = 1;
        }
        std::__throw_out_of_range_fmt[lVar2] = (code)0x20;
        uVar9 = iVar5 + ~uVar9;
        if (0 < (int)uVar9) {
          *(ulong *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
               (ulong)uVar9;
          local_61 = ' ';
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,&local_61,1);
        }
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             0xb;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"] Estimate:",0xb);
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             0x16;
        sVar8 = strlen(local_48);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_48,sVar8);
      }
      std::ostream::flush();
    }
  }
  return;
}

Assistant:

void ProgressBar::update() {
#ifdef IS_MPI
    int myRank;
    MPI_Comm_rank(MPI_COMM_WORLD, &myRank);
    if (myRank == 0) {
#endif

      // only do the progress bar if we are actually running in a tty:
      if (isatty(fileno(stdout)) && (getenv("SGE_TASK_ID") == NULL)) {
        // get the window width:

        int width = 0;
#ifdef _MSC_VER
        CONSOLE_SCREEN_BUFFER_INFO csbi;
        HANDLE hConsole = GetStdHandle(STD_OUTPUT_HANDLE);
        int ret         = GetConsoleScreenBufferInfo(hConsole, &csbi);
        if (ret) { width = csbi.dwSize.X - 1; }
#else
      struct winsize w;
      ioctl(fileno(stdout), TIOCGWINSZ, &w);
      width = w.ws_col;
#endif

        // handle the case when the width is returned as a nonsensical value.
        if (width <= 0) width = 80;

        // We'll use:
        // 31 characters for the completion estimate,
        //  6 for the % complete,
        //  2 characters for the open and closing brackets.

        int avail = width - 31 - 6 - 2;

        ++iteration_;

        if (maximum_ > 0.0) {
          // we know the maximum, so draw a progress bar

          RealType percent =
              std::min(std::max(value_ * 100.0 / maximum_, 1e-6), 100.0);

          int hashes = int(percent * avail / 100.0);

          // compute the best estimate of the ending time:
          time_t current_  = time(NULL);
          time_t end_      = static_cast<time_t>(start_ + (current_ - start_) *
                                                         (100.0 / percent));
          struct tm* ender = localtime(&end_);
          char buffer[22];
          strftime(buffer, 22, "%a %b %d @ %I:%M %p", ender);

#ifdef _MSC_VER
          csbi.dwCursorPosition.X = 0;
          SetConsoleCursorPosition(hConsole, csbi.dwCursorPosition);
#else
        cout << '\r';
#endif
          cout.width(3);
          cout << right << int(percent);
          cout.width(3);
          cout << "% [";
          cout.fill('#');
          if (hashes + 1 < avail) {
            cout.width(hashes + 1);
            cout << progressSpinner_[iteration_ & 3];
          } else {
            cout.width(avail);
            cout << '#';
          }
          cout.fill(' ');
          if (avail - hashes - 1 > 0) {
            cout.width(avail - hashes - 1);
            cout << ' ';
          }
          cout.width(11);
          cout << "] Estimate:";
          cout.width(22);
          cout << buffer;
        }
        cout.flush();
      }
#ifdef IS_MPI
    }
#endif
  }

  void ProgressBar::setStatus(RealType val, RealType max) {
    value_   = val;
    maximum_ = max;
  }
}